

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_card_info2(nvrm_ioctl_card_info2 *s)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  anon_struct_72_18_6cfec3b8 *paVar4;
  char *pcVar5;
  ulong uVar6;
  anon_struct_72_18_6cfec3b8 *paVar7;
  
  uVar6 = 0;
  bVar1 = false;
  paVar4 = s->card;
  do {
    if (uVar6 == 0x20) {
      return;
    }
    paVar7 = s->card + uVar6;
    lVar3 = 0;
    do {
      if (lVar3 == 0x48) goto LAB_00254a70;
      pcVar5 = (char *)((long)&((anon_struct_72_18_6cfec3b8 *)&paVar4->flags)->flags + lVar3);
      lVar3 = lVar3 + 1;
    } while (*pcVar5 == '\0');
    if (!bVar1) {
      fputc(10,_stdout);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG:     %d: ",uVar6 & 0xffffffff);
    }
    else {
      fprintf(_stdout,"%64s    %d: "," ");
    }
    nvrm_pfx = "";
    if (paVar7->flags == 0) {
      iVar2 = _nvrm_field_enabled("flags");
      if (iVar2 != 0) goto LAB_002545ee;
    }
    else {
LAB_002545ee:
      fprintf(_stdout,"%sflags: 0x%08x","");
    }
    pcVar5 = nvrm_sep;
    nvrm_pfx = nvrm_sep;
    if (paVar7->domain == 0) {
      iVar2 = _nvrm_field_enabled("domain");
      if (iVar2 != 0) goto LAB_00254631;
    }
    else {
LAB_00254631:
      fprintf(_stdout,"%sdomain: 0x%08x",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->bus == '\0') {
      iVar2 = _nvrm_field_enabled("bus");
      if (iVar2 != 0) goto LAB_00254671;
    }
    else {
LAB_00254671:
      fprintf(_stdout,"%sbus: %3d",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->slot == '\0') {
      iVar2 = _nvrm_field_enabled("slot");
      if (iVar2 != 0) goto LAB_002546b1;
    }
    else {
LAB_002546b1:
      fprintf(_stdout,"%sslot: %3d",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->function == '\0') {
      iVar2 = _nvrm_field_enabled("function");
      if (iVar2 != 0) goto LAB_002546f1;
    }
    else {
LAB_002546f1:
      fprintf(_stdout,"%sfunction: %3d",pcVar5);
      pcVar5 = nvrm_sep;
    }
    if (paVar7->_pad0 != 0) {
      nvrm_pfx = pcVar5;
      fprintf(_stdout,"%s%s_pad0: 0x%02x%s",pcVar5,colors->err,(ulong)paVar7->_pad0,colors->reset);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->vendor_id == 0) {
      iVar2 = _nvrm_field_enabled("vendor_id");
      if (iVar2 != 0) goto LAB_0025476f;
    }
    else {
LAB_0025476f:
      fprintf(_stdout,"%svendor_id: 0x%04x",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->device_id == 0) {
      iVar2 = _nvrm_field_enabled("device_id");
      if (iVar2 != 0) goto LAB_002547af;
    }
    else {
LAB_002547af:
      fprintf(_stdout,"%sdevice_id: 0x%04x",pcVar5);
      pcVar5 = nvrm_sep;
    }
    if (paVar7->_pad1 != 0) {
      nvrm_pfx = pcVar5;
      fprintf(_stdout,"%s%s_pad1: 0x%08x%s",pcVar5,colors->err,(ulong)paVar7->_pad1,colors->reset);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->gpu_id == 0) {
      iVar2 = _nvrm_field_enabled("gpu_id");
      if (iVar2 != 0) goto LAB_0025482b;
    }
    else {
LAB_0025482b:
      fprintf(_stdout,"%sgpu_id: 0x%08x",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->interrupt == 0) {
      iVar2 = _nvrm_field_enabled("interrupt");
      if (iVar2 != 0) goto LAB_0025486a;
    }
    else {
LAB_0025486a:
      fprintf(_stdout,"%sinterrupt: 0x%08x",pcVar5);
      pcVar5 = nvrm_sep;
    }
    if (paVar7->_pad2 != 0) {
      nvrm_pfx = pcVar5;
      fprintf(_stdout,"%s%s_pad2: 0x%08x%s",pcVar5,colors->err,(ulong)paVar7->_pad2,colors->reset);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->reg_address == 0) {
      iVar2 = _nvrm_field_enabled("reg_address");
      if (iVar2 != 0) goto LAB_002548e6;
    }
    else {
LAB_002548e6:
      fprintf(_stdout,"%sreg_address: 0x%016lx",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->reg_size == 0) {
      iVar2 = _nvrm_field_enabled("reg_size");
      if (iVar2 != 0) goto LAB_00254925;
    }
    else {
LAB_00254925:
      fprintf(_stdout,"%sreg_size: 0x%016lx",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->fb_address == 0) {
      iVar2 = _nvrm_field_enabled("fb_address");
      if (iVar2 != 0) goto LAB_00254964;
    }
    else {
LAB_00254964:
      fprintf(_stdout,"%sfb_address: 0x%016lx",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->fb_size == 0) {
      iVar2 = _nvrm_field_enabled("fb_size");
      if (iVar2 != 0) goto LAB_002549a3;
    }
    else {
LAB_002549a3:
      fprintf(_stdout,"%sfb_size: 0x%016lx",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->index == 0) {
      iVar2 = _nvrm_field_enabled("index");
      if (iVar2 != 0) goto LAB_002549e2;
    }
    else {
LAB_002549e2:
      fprintf(_stdout,"%sindex: %d",pcVar5);
      pcVar5 = nvrm_sep;
    }
    nvrm_pfx = pcVar5;
    if (paVar7->_pad3 != 0) {
      fprintf(_stdout,"%s%s_pad3: 0x%08x%s",pcVar5,colors->err,(ulong)paVar7->_pad3,colors->reset);
      nvrm_pfx = nvrm_sep;
    }
    fputc(10,_stdout);
    bVar1 = true;
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
      bVar1 = true;
    }
LAB_00254a70:
    uVar6 = uVar6 + 1;
    paVar4 = paVar4 + 1;
  } while( true );
}

Assistant:

static void decode_nvrm_ioctl_card_info2(struct nvrm_ioctl_card_info2 *s)
{
	int nl = 0;
	int i, j;
	for (i = 0; i < 32; ++i)
	{
		int valid = 0;
		for (j = 0; j < sizeof(s->card[i]); ++j)
			if (((unsigned char *)&s->card[i])[j] != 0)
			{
				valid = 1;
				break;
			}
		if (valid)
		{
			if (!nl)
			{
				mmt_log_cont_nl();
				nl = 1;
			}

			mmt_log("    %d: ", i);
			nvrm_reset_pfx();
			nvrm_print_x32(&s->card[i], flags);
			nvrm_print_x32(&s->card[i], domain);
			nvrm_print_d32_align(&s->card[i], bus, 3);
			nvrm_print_d32_align(&s->card[i], slot, 3);
			nvrm_print_d32_align(&s->card[i], function, 3);
			nvrm_print_pad_x8(&s->card[i], _pad0);
			nvrm_print_x16(&s->card[i], vendor_id);
			nvrm_print_x16(&s->card[i], device_id);
			nvrm_print_pad_x32(&s->card[i], _pad1);
			nvrm_print_x32(&s->card[i], gpu_id);
			nvrm_print_x32(&s->card[i], interrupt);
			nvrm_print_pad_x32(&s->card[i], _pad2);
			nvrm_print_x64(&s->card[i], reg_address);
			nvrm_print_x64(&s->card[i], reg_size);
			nvrm_print_x64(&s->card[i], fb_address);
			nvrm_print_x64(&s->card[i], fb_size);
			nvrm_print_d32(&s->card[i], index);
			nvrm_print_pad_x32(&s->card[i], _pad3);
			mmt_log_cont_nl();
		}
	}
}